

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.cc
# Opt level: O2

void __thiscall flow::util::Flags::Error::Error(Error *this,ErrorCode code,string *arg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string_view format_str;
  string local_60;
  string local_40 [32];
  
  FlagsErrorCategory::get();
  (**(code **)((long)FlagsErrorCategory::get::cat + 0x20))
            (local_40,&FlagsErrorCategory::get::cat,code);
  format_str.size_ = (size_t)local_40;
  format_str.data_ = (char *)0x6;
  fmt::v5::format<std::__cxx11::string,std::__cxx11::string>
            (&local_60,(v5 *)0x161a29,format_str,arg,in_R9);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string(local_40);
  *(undefined ***)this = &PTR__Error_0019c578;
  this->code_ = code;
  std::__cxx11::string::string((string *)&this->arg_,(string *)arg);
  return;
}

Assistant:

Flags::Error::Error(ErrorCode code, std::string arg)
    : std::runtime_error{fmt::format("{}: {}", 
          FlagsErrorCategory::get().message(static_cast<int>(code)), arg)},
      code_{code},
      arg_{std::move(arg)} {
}